

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_filter(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQOuter *this;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr *o;
  SQInteger SVar5;
  SQObjectValue SVar6;
  SQObjectValue nidx;
  SQObjectPtr local_68;
  SQObjectPtr ret;
  SQObjectPtr val;
  
  pSVar3 = stack_get(v,1);
  this = (pSVar3->super_SQObject)._unVal.pOuter;
  nidx.pTable = (SQTable *)0x0;
  ret.super_SQObject._unVal.pArray = SQArray::Create(v->_sharedstate,0);
  ret.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((ret.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  SVar6 = (SQObjectValue)this->_idx;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (SVar6.nInteger < 1) {
    SVar6.pTable = nidx.pTable;
  }
  do {
    if (SVar6.pTable == nidx.pTable) {
      SQVM::Push(v,&ret);
      SVar5 = 1;
LAB_0011fe84:
      SQObjectPtr::~SQObjectPtr(&val);
      SQObjectPtr::~SQObjectPtr(&ret);
      return SVar5;
    }
    SQArray::Get((SQArray *)this,nidx.nInteger,(SQObjectPtr *)&val.super_SQObject);
    local_68.super_SQObject._type = (pSVar3->super_SQObject)._type;
    local_68.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
    if ((local_68.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_68);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._type = OT_INTEGER;
    local_68.super_SQObject._unVal = nidx;
    SQVM::Push(v,&local_68);
    SQObjectPtr::~SQObjectPtr(&local_68);
    SQVM::Push(v,(SQObjectPtr *)&val.super_SQObject);
    SVar4 = sq_call(v,3,1,0);
    if (SVar4 < 0) {
      SVar5 = -1;
      goto LAB_0011fe84;
    }
    o = SQVM::GetUp(v,-1);
    bVar2 = SQVM::IsFalse(o);
    if (!bVar2) {
      SQArray::Append(ret.super_SQObject._unVal.pArray,&val.super_SQObject);
    }
    SQVM::Pop(v);
    nidx.pTable = (SQTable *)
                  ((long)&((nidx.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                          _vptr_SQRefCounted + 1);
  } while( true );
}

Assistant:

static SQInteger array_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQObjectPtr ret = SQArray::Create(_ss(v),0);
    SQInteger size = a->Size();
    SQObjectPtr val;
    for(SQInteger n = 0; n < size; n++) {
        a->Get(n,val);
        v->Push(o);
        v->Push(n);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _array(ret)->Append(val);
        }
        v->Pop();
    }
    v->Push(ret);
    return 1;
}